

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
InterpreterTest_GlobalInitI32_Test::TestBody(InterpreterTest_GlobalInitI32_Test *this)

{
  pointer *this_00;
  allocator<wasm::Literal> *this_01;
  initializer_list<wasm::Literal> __l;
  bool bVar1;
  element_type *peVar2;
  Const *left;
  Const *right;
  Binary *pBVar3;
  Err *pEVar4;
  char *pcVar5;
  char *pcVar6;
  Name name;
  Name NVar7;
  Name NVar8;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_480;
  AssertHelper local_3f0;
  Message local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar;
  anon_union_16_6_1532cd5a_for_Literal_0 local_3c0;
  anon_union_16_6_1532cd5a_for_Literal_0 local_3a8;
  undefined1 local_398 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> expected;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> results;
  Result<wasm::Ok> local_358 [8];
  Result<wasm::Ok> result;
  undefined1 local_330 [8];
  Interpreter interpreter;
  AssertHelper local_2e0;
  Message local_2d8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__3;
  Result<wasm::Expression_*> expr;
  string local_290;
  AssertHelper local_270;
  Message local_268;
  Result<wasm::Ok> local_260 [47];
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_200;
  Message local_1f8;
  Name local_1f0;
  Result<wasm::Ok> local_1e0 [47];
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__1;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  Type local_168;
  Type local_160;
  Signature local_158;
  Signature local_148;
  Result<wasm::Ok> local_138 [47];
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_;
  Name local_f0;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_e0;
  undefined1 local_d8 [8];
  IRBuilder irBuilder;
  Builder local_28;
  Builder builder;
  shared_ptr<wasm::Module> wasm;
  InterpreterTest_GlobalInitI32_Test *this_local;
  
  std::make_shared<wasm::Module>();
  peVar2 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &builder);
  ::wasm::Builder::Builder(&local_28,peVar2);
  peVar2 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &builder);
  ::wasm::IRBuilder::IRBuilder((IRBuilder *)local_d8,peVar2);
  peVar2 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&builder);
  ::wasm::Name::Name(&local_f0,"global");
  ::wasm::Type::Type((Type *)&gtest_ar_.message_,i32);
  left = ::wasm::Builder::makeConst<int>(&local_28,2);
  right = ::wasm::Builder::makeConst<int>(&local_28,3);
  pBVar3 = ::wasm::Builder::makeBinary(&local_28,AddInt32,(Expression *)left,(Expression *)right);
  name.super_IString.str._M_str = (char *)local_f0.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_e0;
  ::wasm::Builder::makeGlobal
            (name,(Type)local_f0.super_IString.str._M_str,
             (Expression *)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(Mutability)pBVar3);
  ::wasm::Module::addGlobal((unique_ptr *)peVar2);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_e0);
  ::wasm::Name::Name((Name *)&local_148);
  ::wasm::Type::Type(&local_160,none);
  ::wasm::Type::Type(&local_168,i32);
  ::wasm::Signature::Signature(&local_158,local_160,local_168);
  NVar7.super_IString.str._M_str = local_d8;
  NVar7.super_IString.str._M_len = (size_t)local_138;
  ::wasm::IRBuilder::makeBlock(NVar7,local_148);
  pEVar4 = ::wasm::Result<wasm::Ok>::getErr(local_138);
  local_109 = pEVar4 == (Err *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  ::wasm::Result<wasm::Ok>::~Result(local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  pcVar5 = (char *)local_158.results.id;
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)local_108,
               (AssertionResult *)
               "irBuilder.makeBlock(Name{}, Signature(Type::none, Type::i32)).getErr()","true",
               "false",(char *)local_158.results.id);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
               ,0x3be,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    testing::Message::~Message(&local_170);
    pcVar5 = (char *)local_158.results.id;
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    ::wasm::Name::Name(&local_1f0,"global");
    NVar8.super_IString.str._M_str = local_d8;
    NVar8.super_IString.str._M_len = (size_t)local_1e0;
    ::wasm::IRBuilder::makeGlobalGet(NVar8);
    pEVar4 = ::wasm::Result<wasm::Ok>::getErr(local_1e0);
    local_1b1 = pEVar4 == (Err *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
    ::wasm::Result<wasm::Ok>::~Result(local_1e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_1b0,
                 (AssertionResult *)"irBuilder.makeGlobalGet(\"global\").getErr()","true","false",
                 pcVar5);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x3bf,pcVar6);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_1f8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      ::wasm::IRBuilder::visitEnd();
      pEVar4 = ::wasm::Result<wasm::Ok>::getErr(local_260);
      local_231 = pEVar4 == (Err *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_230,&local_231,(type *)0x0);
      ::wasm::Result<wasm::Ok>::~Result(local_260);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
      if (!bVar1) {
        testing::Message::Message(&local_268);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_290,(internal *)local_230,
                   (AssertionResult *)"irBuilder.visitEnd().getErr()","true","false",pcVar5);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                   ,0x3c0,pcVar6);
        testing::internal::AssertHelper::operator=(&local_270,&local_268);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        std::__cxx11::string::~string((string *)&local_290);
        testing::Message::~Message(&local_268);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        ::wasm::IRBuilder::build();
        pEVar4 = ::wasm::Result<wasm::Expression_*>::getErr
                           ((Result<wasm::Expression_*> *)&gtest_ar__3.message_);
        local_2c9 = pEVar4 == (Err *)0x0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
        if (!bVar1) {
          testing::Message::Message(&local_2d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &interpreter.store.instances.
                      super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_2c8,
                     (AssertionResult *)"expr.getErr()","true","false",pcVar5);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2e0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                     ,0x3c3,pcVar5);
          testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
          testing::internal::AssertHelper::~AssertHelper(&local_2e0);
          std::__cxx11::string::~string
                    ((string *)
                     &interpreter.store.instances.
                      super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_2d8);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          ::wasm::Interpreter::Interpreter((Interpreter *)local_330);
          this_00 = &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::shared_ptr<wasm::Module>::shared_ptr
                    ((shared_ptr<wasm::Module> *)this_00,(shared_ptr<wasm::Module> *)&builder);
          ::wasm::Interpreter::addInstance(local_358,(Interpreter *)local_330,this_00);
          std::shared_ptr<wasm::Module>::~shared_ptr
                    ((shared_ptr<wasm::Module> *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          ::wasm::Result<wasm::Expression_*>::operator*
                    ((Result<wasm::Expression_*> *)&gtest_ar__3.message_);
          ::wasm::Interpreter::runTest
                    ((Expression *)
                     &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          ::wasm::Literal::Literal((Literal *)&local_3c0.func,5);
          local_3a8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_3c0;
          local_3a8.func.super_IString.str._M_str = (char *)0x1;
          this_01 = (allocator<wasm::Literal> *)
                    ((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7);
          std::allocator<wasm::Literal>::allocator(this_01);
          __l._M_len = (size_type)local_3a8.func.super_IString.str._M_str;
          __l._M_array = (iterator)local_3a8.i64;
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_398,__l,this_01)
          ;
          std::allocator<wasm::Literal>::~allocator
                    ((allocator<wasm::Literal> *)
                     ((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
          local_480 = &local_3a8;
          do {
            local_480 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)local_480 + -0x18);
            ::wasm::Literal::~Literal((Literal *)&local_480->func);
          } while (local_480 != &local_3c0);
          testing::internal::EqHelper::
          Compare<std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_nullptr>
                    ((EqHelper *)local_3e0,"results","expected",
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                     &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_398);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
          if (!bVar1) {
            testing::Message::Message(&local_3e8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                       ,0x3ca,pcVar5);
            testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
            testing::internal::AssertHelper::~AssertHelper(&local_3f0);
            testing::Message::~Message(&local_3e8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_398);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                     &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          ::wasm::Result<wasm::Ok>::~Result(local_358);
          ::wasm::Interpreter::~Interpreter((Interpreter *)local_330);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        ::wasm::Result<wasm::Expression_*>::~Result
                  ((Result<wasm::Expression_*> *)&gtest_ar__3.message_);
      }
    }
  }
  ::wasm::IRBuilder::~IRBuilder((IRBuilder *)local_d8);
  std::shared_ptr<wasm::Module>::~shared_ptr((shared_ptr<wasm::Module> *)&builder);
  return;
}

Assistant:

TEST(InterpreterTest, GlobalInitI32) {
  auto wasm = std::make_shared<Module>();
  Builder builder(*wasm);
  IRBuilder irBuilder(*wasm);
  wasm->addGlobal(builder.makeGlobal(
    "global",
    Type::i32,
    builder.makeBinary(
      AddInt32, builder.makeConst(int32_t(2)), builder.makeConst(int32_t(3))),
    Builder::Mutable));

  ASSERT_FALSE(
    irBuilder.makeBlock(Name{}, Signature(Type::none, Type::i32)).getErr());
  ASSERT_FALSE(irBuilder.makeGlobalGet("global").getErr());
  ASSERT_FALSE(irBuilder.visitEnd().getErr());

  auto expr = irBuilder.build();
  ASSERT_FALSE(expr.getErr());

  Interpreter interpreter;
  auto result = interpreter.addInstance(wasm);
  auto results = interpreter.runTest(*expr);
  std::vector<Literal> expected{Literal(int32_t(5))};

  EXPECT_EQ(results, expected);
}